

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O1

int archive_write_pax_header_xattrs(archive_write *a,pax *pax,archive_entry *entry)

{
  byte bVar1;
  char cVar2;
  char cVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  byte *pbVar6;
  byte *__s;
  size_t sVar7;
  int *piVar8;
  char *value_00;
  char *pcVar9;
  byte bVar10;
  int iVar11;
  char *pcVar12;
  int iVar13;
  byte *pbVar14;
  ulong uVar15;
  bool bVar16;
  size_t size;
  void *value;
  char *name;
  char *local_90;
  ulong local_60;
  char *local_58;
  byte *local_50;
  archive_string local_48;
  
  wVar4 = archive_entry_xattr_reset(entry);
  if (wVar4 != L'\0') {
    do {
      archive_entry_xattr_next(entry,(char **)&local_50,&local_58,&local_60);
      pbVar14 = local_50;
      bVar1 = *local_50;
      if (bVar1 == 0) {
        sVar7 = 1;
      }
      else {
        iVar13 = 0;
        bVar10 = bVar1;
        pbVar6 = local_50;
        do {
          pbVar6 = pbVar6 + 1;
          bVar16 = (byte)(bVar10 + 0x81) < 0xa2;
          iVar11 = bVar16 + 1 + (uint)bVar16;
          if (bVar10 == 0x25) {
            iVar11 = 3;
          }
          if (bVar10 == 0x3d) {
            iVar11 = 3;
          }
          iVar13 = iVar13 + iVar11;
          bVar10 = *pbVar6;
        } while (bVar10 != 0);
        sVar7 = (size_t)(iVar13 + 1);
      }
      __s = (byte *)malloc(sVar7);
      pbVar6 = __s;
      if (__s == (byte *)0x0) {
        __s = (byte *)0x0;
      }
      else {
        while (bVar1 != 0) {
          pbVar14 = pbVar14 + 1;
          if (((((char)bVar1 < '!') || (bVar1 == 0x25)) || (bVar1 == 0x7f)) || (bVar1 == 0x3d)) {
            *pbVar6 = 0x25;
            pbVar6[1] = "0123456789ABCDEF"[bVar1 >> 4];
            pbVar6[2] = "0123456789ABCDEF"[bVar1 & 0xf];
            pbVar6 = pbVar6 + 3;
          }
          else {
            *pbVar6 = bVar1;
            pbVar6 = pbVar6 + 1;
          }
          bVar1 = *pbVar14;
        }
        *pbVar6 = 0;
      }
      if (__s == (byte *)0x0) {
LAB_0043e7eb:
        local_90 = (char *)0x0;
      }
      else {
        sVar7 = strlen((char *)__s);
        wVar5 = archive_strncpy_l(&pax->l_url_encoded_name,__s,sVar7,pax->sconv_utf8);
        free(__s);
        if (wVar5 != L'\0') {
          piVar8 = __errno_location();
          if (*piVar8 == 0xc) {
            archive_set_error(&a->archive,0xc,"Can\'t allocate memory for Linkname");
            return -0x1e;
          }
          goto LAB_0043e7eb;
        }
        local_90 = (pax->l_url_encoded_name).s;
      }
      pcVar12 = local_58;
      uVar15 = local_60;
      value_00 = (char *)malloc((local_60 * 4 + 2) / 3 + 1);
      pcVar9 = value_00;
      if (value_00 == (char *)0x0) {
        value_00 = (char *)0x0;
      }
      else {
        for (; 2 < uVar15; uVar15 = uVar15 - 3) {
          cVar2 = *pcVar12;
          cVar3 = pcVar12[1];
          bVar1 = pcVar12[2];
          pcVar12 = pcVar12 + 3;
          *pcVar9 = base64_encode_digits[(uint)(int)cVar2 >> 2 & 0x3f];
          pcVar9[1] = base64_encode_digits
                      [(((int)cVar3 & 0xf0U) << 8 | ((int)cVar2 & 3U) << 0x10) >> 0xc];
          pcVar9[2] = base64_encode_digits[(uint)(int)CONCAT11(cVar3,bVar1) >> 6 & 0x3f];
          pcVar9[3] = base64_encode_digits[bVar1 & 0x3f];
          pcVar9 = pcVar9 + 4;
        }
        if (uVar15 == 2) {
          cVar2 = *pcVar12;
          cVar3 = pcVar12[1];
          *pcVar9 = base64_encode_digits[(uint)(int)cVar2 >> 2 & 0x3f];
          pcVar9[1] = base64_encode_digits
                      [(((int)cVar3 & 0xf0U) << 8 | ((int)cVar2 & 3U) << 0x10) >> 0xc];
          pcVar9[2] = base64_encode_digits[(ulong)((int)cVar3 & 0xf) * 4];
          pcVar9 = pcVar9 + 3;
        }
        else if (uVar15 == 1) {
          cVar2 = *pcVar12;
          *pcVar9 = base64_encode_digits[(uint)(int)cVar2 >> 2 & 0x3f];
          pcVar9[1] = base64_encode_digits[((int)cVar2 & 3U) << 4];
          pcVar9 = pcVar9 + 2;
        }
        *pcVar9 = '\0';
      }
      if ((local_90 != (char *)0x0) && (value_00 != (char *)0x0)) {
        local_48.s = (char *)0x0;
        local_48.length = 0;
        local_48.buffer_length = 0;
        archive_strncat(&local_48,"LIBARCHIVE.xattr.",0x11);
        archive_strcat(&local_48,local_90);
        add_pax_attr(&pax->pax_header,local_48.s,value_00);
        archive_string_free(&local_48);
      }
      wVar4 = wVar4 + L'\xffffffff';
      free(value_00);
    } while (wVar4 != L'\0');
  }
  return 0;
}

Assistant:

static int
archive_write_pax_header_xattrs(struct archive_write *a,
    struct pax *pax, struct archive_entry *entry)
{
	struct archive_string s;
	int i = archive_entry_xattr_reset(entry);

	while (i--) {
		const char *name;
		const void *value;
		char *encoded_value;
		char *url_encoded_name = NULL, *encoded_name = NULL;
		size_t size;
		int r;

		archive_entry_xattr_next(entry, &name, &value, &size);
		url_encoded_name = url_encode(name);
		if (url_encoded_name != NULL) {
			/* Convert narrow-character to UTF-8. */
			r = archive_strcpy_l(&(pax->l_url_encoded_name),
			    url_encoded_name, pax->sconv_utf8);
			free(url_encoded_name); /* Done with this. */
			if (r == 0)
				encoded_name = pax->l_url_encoded_name.s;
			else if (errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Linkname");
				return (ARCHIVE_FATAL);
			}
		}

		encoded_value = base64_encode((const char *)value, size);

		if (encoded_name != NULL && encoded_value != NULL) {
			archive_string_init(&s);
			archive_strcpy(&s, "LIBARCHIVE.xattr.");
			archive_strcat(&s, encoded_name);
			add_pax_attr(&(pax->pax_header), s.s, encoded_value);
			archive_string_free(&s);
		}
		free(encoded_value);
	}
	return (ARCHIVE_OK);
}